

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall
QPDFWriter::writeTrailer
          (QPDFWriter *this,trailer_e which,int size,bool xref_stream,qpdf_offset_t prev,
          int linearization_pass)

{
  size_t nspaces;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *__v;
  string *psVar3;
  size_type sVar4;
  Count *pCVar5;
  pointer pcVar6;
  bool bVar7;
  char cVar8;
  ulong uVar9;
  __index_type _Var10;
  int iVar11;
  QPDF_Dictionary *pQVar12;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar13;
  qpdf_offset_t *pqVar14;
  _Base_ptr p_Var15;
  uint uVar16;
  uint uVar17;
  undefined7 in_register_00000009;
  size_type *__n;
  undefined8 __n_00;
  size_type *psVar18;
  uint uVar19;
  type ii;
  size_type *psVar20;
  undefined8 uVar21;
  _Alloc_hider _Var22;
  _Base_ptr p_Var23;
  uint uVar24;
  uint uVar25;
  undefined1 *puVar26;
  string __str;
  unsigned_long_long __uval;
  QPDFObjectHandle trailer;
  string local_140;
  uint local_11c;
  string local_118;
  trailer_e local_f4;
  size_type *local_f0;
  int local_e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  QPDFObjectHandle local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Base_ptr local_60;
  ulong local_58;
  QPDF_String local_50;
  
  __n_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT71(in_register_00000009,xref_stream);
  getTrimmedTrailer((QPDFWriter *)&local_70);
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((int)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT71(in_register_00000009,xref_stream) == 0) {
    ::qpdf::pl::Count::write(peVar2->pipeline,0x27d852,(void *)0xa,__n_00);
  }
  else {
    (peVar2->cur_data_key)._M_string_length = 0;
    *(peVar2->cur_data_key)._M_dataplus._M_p = '\0';
  }
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar2->pipeline,0x27dc1d,(void *)0x1,__n_00);
  }
  cVar8 = (char)(size >> 0x1f);
  if (which == t_lin_second) {
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27d85d,(void *)0x7,__n_00);
    uVar19 = -size;
    if (0 < size) {
      uVar19 = size;
    }
    uVar24 = 1;
    if (9 < uVar19) {
      __n_00 = ZEXT48(uVar19);
      uVar25 = 4;
      do {
        uVar24 = uVar25;
        uVar16 = (uint)__n_00;
        if (uVar16 < 100) {
          uVar24 = uVar24 - 2;
          goto LAB_001eda87;
        }
        if (uVar16 < 1000) {
          uVar24 = uVar24 - 1;
          goto LAB_001eda87;
        }
        if (uVar16 < 10000) goto LAB_001eda87;
        __n_00 = (ulong)__n_00 / 10000;
        uVar25 = uVar24 + 4;
      } while (99999 < uVar16);
      uVar24 = uVar24 + 1;
    }
LAB_001eda87:
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_140,(char)uVar24 - cVar8);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_140._M_dataplus._M_p + ((uint)size >> 0x1f),uVar24,uVar19);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_140._M_dataplus._M_p,(void *)local_140._M_string_length,__n_00
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_118._M_dataplus._M_p = (pointer)local_70._M_allocated_capacity;
    local_118._M_string_length = local_70._8_8_;
    __n_00 = local_70._M_allocated_capacity;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      __n_00 = &__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_70._8_8_ + 8) = *(_Atomic_word *)(local_70._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_70._8_8_ + 8) = *(_Atomic_word *)(local_70._8_8_ + 8) + 1;
      }
    }
    pQVar12 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)&local_118);
    if (pQVar12 == (QPDF_Dictionary *)0x0) {
      p_Var15 = (_Base_ptr)0x0;
    }
    else {
      p_Var15 = (pQVar12->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    local_f4 = which;
    local_e4 = linearization_pass;
    pQVar12 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)&local_118);
    p_Var23 = &(pQVar12->items)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar12 == (QPDF_Dictionary *)0x0) {
      p_Var23 = (_Base_ptr)0x0;
    }
    if (p_Var15 != p_Var23) {
      local_11c = -size;
      if (0 < size) {
        local_11c = size;
      }
      local_f0 = (size_type *)-prev;
      if (0 < prev) {
        local_f0 = (size_type *)prev;
      }
      local_58 = (ulong)prev >> 0x3f;
      local_60 = p_Var23;
      do {
        __v = *(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                **)(p_Var15 + 2);
        if (__v != (variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    *)0x0) {
          _Var10 = (__v->
                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   ).
                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   ._M_index;
          if (_Var10 == '\x0f') {
            pvVar13 = std::
                      get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                                (__v);
LAB_001ed6f5:
            _Var10 = *(__index_type *)
                      ((long)&(((pvVar13->obj).
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                              value).
                              super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                              .
                              super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                              .
                              super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                              .
                              super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                      + 0x30);
          }
          else if (_Var10 == '\r') {
            pvVar13 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                       *)QPDF::resolve(*(QPDF **)((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x10),
                                       *(QPDFObjGen *)
                                        ((long)&__v[1].
                                                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                .
                                                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                .
                                                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                .
                                                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                .
                                                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                .
                                                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                ._M_u + 0x18));
            goto LAB_001ed6f5;
          }
          if (_Var10 != '\x02') {
            peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (peVar2->qdf_mode == true) {
              ::qpdf::pl::Count::write(peVar2->pipeline,0x27c008,(void *)0x2,__n_00);
            }
            peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (peVar2->qdf_mode == false) {
              ::qpdf::pl::Count::write(peVar2->pipeline,0x27dabc,(void *)0x1,__n_00);
            }
            ::qpdf::Name::normalize(&local_140,(string *)(p_Var15 + 1));
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,(int)local_140._M_dataplus._M_p,(void *)local_140._M_string_length
                       ,__n_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
            ::qpdf::pl::Count::write
                      (((this->m).
                        super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->pipeline,0x27dabc,(void *)0x1,__n_00);
            iVar11 = std::__cxx11::string::compare((char *)(p_Var15 + 1));
            if (iVar11 == 0) {
              uVar19 = 1;
              if (9 < local_11c) {
                uVar24 = local_11c;
                uVar25 = 4;
                do {
                  uVar19 = uVar25;
                  if (uVar24 < 100) {
                    uVar19 = uVar19 - 2;
                    goto LAB_001ed86c;
                  }
                  if (uVar24 < 1000) {
                    uVar19 = uVar19 - 1;
                    goto LAB_001ed86c;
                  }
                  if (uVar24 < 10000) goto LAB_001ed86c;
                  __n_00 = (ulong)uVar24 / 10000;
                  bVar7 = 99999 < uVar24;
                  uVar24 = uVar24 / 10000;
                  uVar25 = uVar19 + 4;
                } while (bVar7);
                uVar19 = uVar19 + 1;
              }
LAB_001ed86c:
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_140,(char)uVar19 - cVar8);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_140._M_dataplus._M_p + ((uint)size >> 0x1f),uVar19,local_11c);
              ::qpdf::pl::Count::write
                        (((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline,(int)local_140._M_dataplus._M_p,
                         (void *)local_140._M_string_length,__n_00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              if (local_f4 == t_lin_first) {
                ::qpdf::pl::Count::write
                          (((this->m).
                            super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->pipeline,0x27d865,(void *)0x7,__n_00);
                uVar9 = local_58;
                pCVar5 = ((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline;
                psVar3 = pCVar5->str;
                __n = &psVar3->_M_string_length;
                psVar20 = (size_type *)&pCVar5->count;
                if (psVar3 != (string *)0x0) {
                  psVar20 = __n;
                }
                uVar19 = 1;
                if ((size_type *)0x9 < local_f0) {
                  __n = local_f0;
                  uVar24 = 4;
                  do {
                    uVar19 = uVar24;
                    if (__n < (size_type *)0x64) {
                      uVar19 = uVar19 - 2;
                      goto LAB_001ed972;
                    }
                    if (__n < (size_type *)0x3e8) {
                      uVar19 = uVar19 - 1;
                      goto LAB_001ed972;
                    }
                    if (__n < (size_type *)0x2710) goto LAB_001ed972;
                    psVar18 = (size_type *)((ulong)__n / 10000);
                    bVar7 = (size_type *)0x1869f < __n;
                    __n = psVar18;
                    uVar24 = uVar19 + 4;
                  } while (bVar7);
                  uVar19 = uVar19 + 1;
                }
LAB_001ed972:
                sVar4 = *psVar20;
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                std::__cxx11::string::_M_construct((ulong)&local_140,(char)local_58 + (char)uVar19);
                std::__detail::__to_chars_10_impl<unsigned_long_long>
                          (local_140._M_dataplus._M_p + uVar9,uVar19,(unsigned_long_long)local_f0);
                ::qpdf::pl::Count::write
                          (((this->m).
                            super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->pipeline,(int)local_140._M_dataplus._M_p,
                           (void *)local_140._M_string_length,(size_t)__n);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != &local_140.field_2) {
                  operator_delete(local_140._M_dataplus._M_p,
                                  local_140.field_2._M_allocated_capacity + 1);
                }
                p_Var23 = local_60;
                pCVar5 = ((this->m).
                          super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->pipeline;
                __n_00 = pCVar5->str;
                pqVar14 = &pCVar5->count;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__n_00 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  pqVar14 = (qpdf_offset_t *)(__n_00 + 8);
                }
                nspaces = (sVar4 - *pqVar14) + 0x15;
                if ((long)(sVar4 - *pqVar14) < -0x15) {
                  QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(nspaces);
                }
                writePad(this,nspaces);
              }
            }
            else {
              local_80.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(element_type **)(p_Var15 + 2);
              local_80.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[2]._M_parent;
              if ((_Base_ptr)
                  local_80.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Base_ptr)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&((_Base_ptr)
                           local_80.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_parent =
                       *(int *)&((_Base_ptr)
                                local_80.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_parent + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&((_Base_ptr)
                           local_80.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_parent =
                       *(int *)&((_Base_ptr)
                                local_80.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_parent + 1;
                }
              }
              __n_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
              unparseChild(this,&local_80,1,0);
              if ((_Base_ptr)
                  local_80.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Base_ptr)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_80.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
            peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if (peVar2->qdf_mode == true) {
              ::qpdf::pl::Count::write(peVar2->pipeline,0x27dc1d,(void *)0x1,__n_00);
            }
          }
        }
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      } while (p_Var15 != p_Var23);
    }
    linearization_pass = local_e4;
    which = local_f4;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
      linearization_pass = local_e4;
      which = local_f4;
    }
  }
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar2->pipeline,0x27dabc,(void *)0x1,__n_00);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27d86d,(void *)0x6,__n_00);
  if (linearization_pass == 0) {
    if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        deterministic_id == true) {
      computeDeterministicIDData(this);
    }
LAB_001edbe6:
    generateID(this);
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar6 = (peVar2->id1)._M_dataplus._M_p;
    local_c0 = &local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar6,pcVar6 + (peVar2->id1)._M_string_length);
    paVar1 = &local_118.field_2;
    if (local_c0 == &local_b0) {
      local_118.field_2._8_8_ = local_b0._8_8_;
      local_118._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_118._M_dataplus._M_p = (pointer)local_c0;
    }
    local_118.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
    local_118.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
    local_118._M_string_length = local_b8;
    local_b8 = 0;
    local_b0._M_local_buf[0] = '\0';
    local_c0 = &local_b0;
    QPDF_String::unparse_abi_cxx11_(&local_140,(QPDF_String *)&local_118,true);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_140._M_dataplus._M_p,(void *)local_140._M_string_length,__n_00
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,
                                        local_b0._M_local_buf[0]) + 1);
    }
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar6 = (peVar2->id2)._M_dataplus._M_p;
    local_e0 = &local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar6,pcVar6 + (peVar2->id2)._M_string_length);
    if (local_e0 == &local_d0) {
      local_118.field_2._8_8_ = local_d0._8_8_;
      local_118._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_118._M_dataplus._M_p = (pointer)local_e0;
    }
    local_118.field_2._M_allocated_capacity._1_7_ = local_d0._M_allocated_capacity._1_7_;
    local_118.field_2._M_local_buf[0] = local_d0._M_local_buf[0];
    local_118._M_string_length = (size_type)local_d8;
    local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d0._M_local_buf[0] = '\0';
    local_e0 = &local_d0;
    QPDF_String::unparse_abi_cxx11_(&local_140,(QPDF_String *)&local_118,true);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_140._M_dataplus._M_p,(void *)local_140._M_string_length,__n_00
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 == &local_d0) goto LAB_001edf04;
    uVar21 = CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]);
    _Var22._M_p = (pointer)local_e0;
  }
  else {
    if (linearization_pass != 1) goto LAB_001edbe6;
    getOriginalID1_abi_cxx11_(&local_140,this);
    pCVar5 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline;
    if ((void *)local_140._M_string_length == (void *)0x0) {
      ::qpdf::pl::Count::write(pCVar5,0x27d874,(void *)0x22,__n_00);
    }
    else {
      ::qpdf::pl::Count::write(pCVar5,0x27d85b,(void *)0x1,__n_00);
      local_a0 = &local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_140._M_dataplus._M_p,
                 local_140._M_string_length + local_140._M_dataplus._M_p);
      paVar1 = &local_50.val.field_2;
      if (local_a0 == &local_90) {
        local_50.val.field_2._8_8_ = local_90._8_8_;
        local_50.val._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_50.val._M_dataplus._M_p = (pointer)local_a0;
      }
      local_50.val.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
      local_50.val.field_2._M_local_buf[0] = local_90._M_local_buf[0];
      local_50.val._M_string_length = local_98;
      local_98 = 0;
      local_90._M_local_buf[0] = '\0';
      local_a0 = &local_90;
      QPDF_String::unparse_abi_cxx11_(&local_118,&local_50,true);
      sVar4 = local_118._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.val._M_dataplus._M_p != paVar1) {
        operator_delete(local_50.val._M_dataplus._M_p,local_50.val.field_2._0_8_ + 1);
      }
      puVar26 = (undefined1 *)
                ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar4 + -0x10))->
                        _M_weak_count + 2);
      if (local_a0 != &local_90) {
        operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,
                                          local_90._M_local_buf[0]) + 1);
      }
      for (; puVar26 != (undefined1 *)0x0; puVar26 = puVar26 + -1) {
        ::qpdf::pl::Count::write
                  (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->pipeline,0x27fdd5,(void *)0x1,__n_00);
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27d21f,(void *)0x1,__n_00);
    }
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27d874,(void *)0x22,__n_00);
    uVar21 = local_140.field_2._M_allocated_capacity;
    _Var22._M_p = local_140._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == &local_140.field_2) goto LAB_001edf04;
  }
  operator_delete(_Var22._M_p,uVar21 + 1);
LAB_001edf04:
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x26916c,(void *)0x1,__n_00);
  if ((which != t_lin_second) &&
     (peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar2->encrypted == true)) {
    ::qpdf::pl::Count::write(peVar2->pipeline,0x27d897,(void *)0xa,__n_00);
    uVar19 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->encryption_dict_objid;
    uVar24 = -uVar19;
    if (0 < (int)uVar19) {
      uVar24 = uVar19;
    }
    uVar25 = 1;
    if (9 < uVar24) {
      __n_00 = ZEXT48(uVar24);
      uVar16 = 4;
      do {
        uVar25 = uVar16;
        uVar17 = (uint)__n_00;
        if (uVar17 < 100) {
          uVar25 = uVar25 - 2;
          goto LAB_001edfb5;
        }
        if (uVar17 < 1000) {
          uVar25 = uVar25 - 1;
          goto LAB_001edfb5;
        }
        if (uVar17 < 10000) goto LAB_001edfb5;
        __n_00 = (ulong)__n_00 / 10000;
        uVar16 = uVar25 + 4;
      } while (99999 < uVar17);
      uVar25 = uVar25 + 1;
    }
LAB_001edfb5:
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_140,(char)uVar25 - (char)((int)uVar19 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_140._M_dataplus._M_p + (uVar19 >> 0x1f),uVar25,uVar24);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_140._M_dataplus._M_p,(void *)local_140._M_string_length,__n_00
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27f618,(void *)0x4,__n_00);
  }
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar2->pipeline,0x27dc1d,(void *)0x1,__n_00);
  }
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->qdf_mode == false) {
    ::qpdf::pl::Count::write(peVar2->pipeline,0x27dabc,(void *)0x1,__n_00);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27dcbd,(void *)0x2,__n_00);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  return;
}

Assistant:

void
QPDFWriter::writeTrailer(
    trailer_e which, int size, bool xref_stream, qpdf_offset_t prev, int linearization_pass)
{
    QPDFObjectHandle trailer = getTrimmedTrailer();
    if (xref_stream) {
        m->cur_data_key.clear();
    } else {
        writeString("trailer <<");
    }
    writeStringQDF("\n");
    if (which == t_lin_second) {
        writeString(" /Size ");
        writeString(std::to_string(size));
    } else {
        for (auto const& [key, value]: trailer.as_dictionary()) {
            if (value.null()) {
                continue;
            }
            writeStringQDF("  ");
            writeStringNoQDF(" ");
            writeString(Name::normalize(key));
            writeString(" ");
            if (key == "/Size") {
                writeString(std::to_string(size));
                if (which == t_lin_first) {
                    writeString(" /Prev ");
                    qpdf_offset_t pos = m->pipeline->getCount();
                    writeString(std::to_string(prev));
                    writePad(QIntC::to_size(pos - m->pipeline->getCount() + 21));
                }
            } else {
                unparseChild(value, 1, 0);
            }
            writeStringQDF("\n");
        }
    }

    // Write ID
    writeStringQDF(" ");
    writeString(" /ID [");
    if (linearization_pass == 1) {
        std::string original_id1 = getOriginalID1();
        if (original_id1.empty()) {
            writeString("<00000000000000000000000000000000>");
        } else {
            // Write a string of zeroes equal in length to the representation of the original ID.
            // While writing the original ID would have the same number of bytes, it would cause a
            // change to the deterministic ID generated by older versions of the software that
            // hard-coded the length of the ID to 16 bytes.
            writeString("<");
            size_t len = QPDF_String(original_id1).unparse(true).length() - 2;
            for (size_t i = 0; i < len; ++i) {
                writeString("0");
            }
            writeString(">");
        }
        writeString("<00000000000000000000000000000000>");
    } else {
        if ((linearization_pass == 0) && (m->deterministic_id)) {
            computeDeterministicIDData();
        }
        generateID();
        writeString(QPDF_String(m->id1).unparse(true));
        writeString(QPDF_String(m->id2).unparse(true));
    }
    writeString("]");

    if (which != t_lin_second) {
        // Write reference to encryption dictionary
        if (m->encrypted) {
            writeString(" /Encrypt ");
            writeString(std::to_string(m->encryption_dict_objid));
            writeString(" 0 R");
        }
    }

    writeStringQDF("\n");
    writeStringNoQDF(" ");
    writeString(">>");
}